

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O0

void dis_pp_expr(decoctx *deco,dis_res *dres,easm_expr *expr,uint64_t pos)

{
  ulong uVar1;
  int iVar2;
  uint32_t uVar3;
  char *pcVar4;
  easm_expr *peVar5;
  int local_48;
  uint local_44;
  int j;
  uint32_t num;
  ull ptr;
  easm_expr *oe1;
  easm_expr *oe2;
  uint64_t pos_local;
  easm_expr *expr_local;
  dis_res *dres_local;
  decoctx *deco_local;
  
  if (expr->e1 != (easm_expr *)0x0) {
    dis_pp_expr(deco,dres,expr->e1,pos);
  }
  if (expr->e2 != (easm_expr *)0x0) {
    dis_pp_expr(deco,dres,expr->e2,pos);
  }
  if (expr->sinsn != (easm_sinsn *)0x0) {
    dis_pp_sinsn(deco,dres,expr->sinsn,pos);
  }
  easm_substpos_expr(expr,pos);
  iVar2 = easm_cfold_expr(expr);
  if (iVar2 != 0) {
    if (expr->special == EASM_SPEC_CTARG) {
      mark(deco,(uint32_t)expr->num,2);
      pcVar4 = deco_label(deco,expr->num);
      expr->alabel = pcVar4;
      iVar2 = is_nr_mark(deco,(uint32_t)expr->num);
      if (iVar2 != 0) {
        dres->endmark = 1;
      }
    }
    else if (expr->special == EASM_SPEC_BTARG) {
      mark(deco,(uint32_t)expr->num,1);
      pcVar4 = deco_label(deco,expr->num);
      expr->alabel = pcVar4;
    }
    if (((expr->num & 0x8000000000000000) != 0) && (expr->special == EASM_SPEC_NONE)) {
      expr->type = EASM_EXPR_NEG;
      peVar5 = easm_expr_num(EASM_EXPR_NUM,-expr->num);
      expr->e1 = peVar5;
      expr->num = 0;
    }
  }
  if (((expr->type == EASM_EXPR_ADD) && (expr->e1->type == EASM_EXPR_NUM)) && (expr->e1->num == 0))
  {
    peVar5 = expr->e2;
    free(expr->e1);
    memcpy(expr,peVar5,0x88);
    free(peVar5);
  }
  if (((expr->type == EASM_EXPR_ADD) || (expr->type == EASM_EXPR_SUB)) &&
     ((expr->e2->type == EASM_EXPR_NUM && (expr->e2->num == 0)))) {
    peVar5 = expr->e1;
    free(expr->e2);
    memcpy(expr,peVar5,0x88);
    free(peVar5);
  }
  if (((expr->type == EASM_EXPR_ADD) && (expr->e2->type == EASM_EXPR_NUM)) &&
     ((expr->e2->num & 0x8000000000000000) != 0)) {
    expr->e2->num = -expr->e2->num;
    expr->type = EASM_EXPR_SUB;
  }
  if ((expr->type == EASM_EXPR_MEM) && (expr->special == EASM_SPEC_LITERAL)) {
    if (expr->e1->type == EASM_EXPR_NUM) {
      uVar1 = expr->e1->num;
      mark(deco,(uint32_t)uVar1,0x10);
      if ((uVar1 < deco->codebase) || (deco->codebase + deco->codesz < uVar1)) {
        expr->special = EASM_SPEC_NONE;
      }
      else {
        uVar3 = ed_getcbsz(deco->isa,deco->varinfo);
        if (uVar3 != 8) {
          abort();
        }
        local_44 = 0;
        for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
          local_44 = (uint)deco->code[(uVar1 - deco->codebase) + (long)local_48] <<
                     ((byte)(local_48 << 3) & 0x1f) | local_44;
        }
        expr->alit = (ulong)local_44;
      }
    }
    else {
      expr->special = EASM_SPEC_NONE;
    }
  }
  return;
}

Assistant:

static void dis_pp_expr(struct decoctx *deco, struct dis_res *dres, struct easm_expr *expr, uint64_t pos) {
	if (expr->e1)
		dis_pp_expr(deco, dres, expr->e1, pos);
	if (expr->e2)
		dis_pp_expr(deco, dres, expr->e2, pos);
	if (expr->sinsn)
		dis_pp_sinsn(deco, dres, expr->sinsn, pos);
	easm_substpos_expr(expr, pos);
	if (easm_cfold_expr(expr)) {
		if (expr->special == EASM_SPEC_CTARG) {
			mark(deco, expr->num, 2);
			expr->alabel = deco_label(deco, expr->num);
			if (is_nr_mark(deco, expr->num))
				dres->endmark = 1;
		} else if (expr->special == EASM_SPEC_BTARG) {
			mark(deco, expr->num, 1);
			expr->alabel = deco_label(deco, expr->num);
		}
		if (expr->num & 1ull << 63 && !expr->special) {
			expr->type = EASM_EXPR_NEG;
			expr->e1 = easm_expr_num(EASM_EXPR_NUM, -expr->num);
			expr->num = 0;
		}
	}
	if (expr->type == EASM_EXPR_ADD && expr->e1->type == EASM_EXPR_NUM && expr->e1->num == 0) {
		struct easm_expr *oe2 = expr->e2;
		free(expr->e1);
		*expr = *oe2;
		free(oe2);
	}
	if ((expr->type == EASM_EXPR_ADD || expr->type == EASM_EXPR_SUB) && expr->e2->type == EASM_EXPR_NUM && expr->e2->num == 0) {
		struct easm_expr *oe1 = expr->e1;
		free(expr->e2);
		*expr = *oe1;
		free(oe1);
	}
	if (expr->type == EASM_EXPR_ADD && expr->e2->type == EASM_EXPR_NUM && expr->e2->num & 1ull << 63) {
		expr->e2->num = -expr->e2->num;
		expr->type = EASM_EXPR_SUB;
	}
	if (expr->type == EASM_EXPR_MEM && expr->special == EASM_SPEC_LITERAL) {
		if (expr->e1->type != EASM_EXPR_NUM) {
			expr->special = EASM_SPEC_NONE;
		} else {
			ull ptr = expr->e1->num;
			mark(deco, ptr, 0x10);
			if (ptr < deco->codebase || ptr > deco->codebase + deco->codesz) {
				expr->special = EASM_SPEC_NONE;
			} else {
				if (ed_getcbsz(deco->isa, deco->varinfo) != 8)
					abort();
				uint32_t num = 0;
				int j;
				for (j = 0; j < 4; j++)
					num |= deco->code[ptr - deco->codebase + j] << j*8;
				expr->alit = num;
			}
		}
	}
}